

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
               *condc,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RDX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  BasicWriter<char> *in_RDI;
  char value_01;
  BasicWriter<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ItemNamer *in_stack_ffffffffffffffe0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *algc;
  
  algc = in_RDX;
  FunctionalConstraint::GetResultVar((FunctionalConstraint *)in_RSI);
  ItemNamer::at((ItemNamer *)condc,(size_t)vnam);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI,(char *)in_RDX);
  value.size_ = (size_t)in_stack_ffffffffffffffe0;
  value.data_ = in_stack_ffffffffffffffd8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,value);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI,(char *)in_RDX);
  value_01 = (char)((ulong)in_RDX >> 0x38);
  value_00.size_ = (size_t)in_stack_ffffffffffffffe0;
  value_00.data_ = in_stack_ffffffffffffffd8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,value_00);
  fmt::BasicWriter<char>::operator<<(in_RDI,value_01);
  CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
  ::GetArguments((CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                  *)((long)&in_RSI->buffer_ + 0x18));
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::QuadAndLinTerms,0>
            (in_RSI,algc,in_stack_ffffffffffffffe0);
  fmt::BasicWriter<char>::operator<<(in_RDI,value_01);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ConditionalConstraint<Con>& condc,
                    ItemNamer& vnam) {
  wrt << vnam.at(condc.GetResultVar()) << "==1 <==> ";
  wrt << '(';
  WriteModelItem(wrt, condc.GetArguments(), vnam);
  wrt << ')';
}